

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkPerModifications(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  precise_unit pVar6;
  string local_70;
  string local_50;
  
  if (((uint)match_flags >> 0x15 & 1) == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"per","");
    sVar3 = findWordOperatorSep(unit_string,&local_50);
    dVar5 = extraout_XMM0_Qa;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      dVar5 = extraout_XMM0_Qa_00;
    }
    if (sVar3 == 0xffffffffffffffff) {
      bVar2 = true;
    }
    else {
      if (sVar3 == 0) {
        pcVar4 = "1/";
        sVar3 = 0;
      }
      else {
        pcVar4 = "/";
      }
      std::__cxx11::string::replace((ulong)unit_string,sVar3,(char *)0x3,(ulong)pcVar4);
      pcVar1 = (unit_string->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + unit_string->_M_string_length);
      pVar6 = unit_from_string_internal(&local_70,match_flags + 0x80000);
      match_flags = pVar6._8_8_;
      dVar5 = pVar6.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar2 = (match_flags & 0xffffffff) == 0xfa94a488 || NAN(dVar5);
    }
    if (!bVar2) goto LAB_0017cbde;
  }
  dVar5 = NAN;
  match_flags = 0xfa94a488;
LAB_0017cbde:
  pVar6.base_units_ = (unit_data)(int)match_flags;
  pVar6.commodity_ = (int)(match_flags >> 0x20);
  pVar6.multiplier_ = dVar5;
  return pVar6;
}

Assistant:

static precise_unit
    checkPerModifications(std::string unit_string, std::uint64_t match_flags)
{
    // try changing out any "per" words for division sign
    if ((match_flags & no_per_operators) == 0) {
        auto fnd = findWordOperatorSep(unit_string, "per");
        if (fnd != std::string::npos) {
            if (fnd == 0) {
                unit_string.replace(fnd, 3, "1/");
            } else {
                unit_string.replace(fnd, 3, "/");
            }
            auto retunit = unit_from_string_internal(
                unit_string, match_flags + per_operator1);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}